

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

Logger * el::Loggers::reconfigureLogger
                   (string *identity,ConfigurationType configurationType,string *value)

{
  Logger *this;
  
  this = getLogger(identity,true);
  if (this != (Logger *)0x0) {
    Configurations::set(&this->m_configurations,Global,configurationType,value);
    Logger::reconfigure(this);
  }
  return this;
}

Assistant:

Logger* Loggers::reconfigureLogger(const std::string& identity, ConfigurationType configurationType,
                                   const std::string& value) {
  Logger* logger = Loggers::getLogger(identity);
  if (logger == nullptr) {
    return nullptr;
  }
  logger->configurations()->set(Level::Global, configurationType, value);
  logger->reconfigure();
  return logger;
}